

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_filesystem_dirtier.cc
# Opt level: O1

void __thiscall PeriodicFilesystemDirtier::Tick(PeriodicFilesystemDirtier *this)

{
  long lVar1;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  if ((this->next_cycle_).__d.__r <= lVar1) {
    FilesystemDirt::AddDirtyPath(this->filesystem_dirt_,&this->path_);
    (this->next_cycle_).__d.__r = lVar1 + (this->interval_).__r;
  }
  return;
}

Assistant:

void PeriodicFilesystemDirtier::Tick() {
  auto now = std::chrono::steady_clock::now();
  if (now >= next_cycle_) {
    filesystem_dirt_->AddDirtyPath(path_);
    next_cycle_ = now + interval_;
  }
}